

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 458.hpp
# Opt level: O2

void __thiscall njoy::ENDFtk::section::Type<1,_458>::Type(Type<1,_458> *this,Type<1,_458> *param_1)

{
  double dVar1;
  undefined4 uVar2;
  
  uVar2 = *(undefined4 *)
           &(param_1->super_BaseWithoutMT<njoy::ENDFtk::section::Type<1,_458>_>).field_0x4;
  dVar1 = (param_1->super_BaseWithoutMT<njoy::ENDFtk::section::Type<1,_458>_>).atomicWeightRatio_;
  (this->super_BaseWithoutMT<njoy::ENDFtk::section::Type<1,_458>_>).ZA_ =
       (param_1->super_BaseWithoutMT<njoy::ENDFtk::section::Type<1,_458>_>).ZA_;
  *(undefined4 *)&(this->super_BaseWithoutMT<njoy::ENDFtk::section::Type<1,_458>_>).field_0x4 =
       uVar2;
  (this->super_BaseWithoutMT<njoy::ENDFtk::section::Type<1,_458>_>).atomicWeightRatio_ = dVar1;
  std::__detail::__variant::
  _Move_ctor_base<false,_njoy::ENDFtk::section::Type<1,_458>::ThermalPointComponents,_njoy::ENDFtk::section::Type<1,_458>::PolynomialComponents,_njoy::ENDFtk::section::Type<1,_458>::TabulatedComponents>
  ::_Move_ctor_base((_Move_ctor_base<false,_njoy::ENDFtk::section::Type<1,_458>::ThermalPointComponents,_njoy::ENDFtk::section::Type<1,_458>::PolynomialComponents,_njoy::ENDFtk::section::Type<1,_458>::TabulatedComponents>
                     *)&this->data_,
                    (_Move_ctor_base<false,_njoy::ENDFtk::section::Type<1,_458>::ThermalPointComponents,_njoy::ENDFtk::section::Type<1,_458>::PolynomialComponents,_njoy::ENDFtk::section::Type<1,_458>::TabulatedComponents>
                     *)&param_1->data_);
  return;
}

Assistant:

class ENDFTK_PYTHON_EXPORT Type< 1, 458 > :
    protected BaseWithoutMT< Type< 1, 458 > > {

    friend BaseWithoutMT< Type< 1, 458 > >;

  public:

    #include "ENDFtk/section/1/458/ThermalPointComponents.hpp"
    #include "ENDFtk/section/1/458/PolynomialComponents.hpp"
    #include "ENDFtk/section/1/458/EnergyReleaseComponent.hpp"
    #include "ENDFtk/section/1/458/TabulatedComponents.hpp"

    using FissionEnergyReleaseData = std::variant< // LFC=0 NPLY=0
                                                   ThermalPointComponents,
                                                   // LFC=0 NPLY!=0
                                                   PolynomialComponents,
                                                   // LFC=1 NPLY=0
                                                   TabulatedComponents >;

  protected:

    /* fields */
    FissionEnergyReleaseData data_;

    /* auxiliary functions */
    #include "ENDFtk/section/1/458/src/readFissionEnergyReleaseData.hpp"

  public:

    /* constructor */
    #include "ENDFtk/section/1/458/src/ctor.hpp"

    /* methods */

    /**
     *  @brief Return the tabulated energy release flag
     */
    int LFC() const { return std::visit( [] ( const auto& v ) -> long
                                            { return v.LFC(); },
                                         this->data_ ); }

    /**
     *  @brief Return the tabulated energy release flag
     */
    bool tabulatedEnergyRelease() const { return this->LFC(); }

    /**
     *  @brief Return the polynomial expansion order
     */
    int NFC() const { return std::visit( [] ( const auto& v ) -> long
                                            { return v.NFC(); },
                                         this->data_ ); }

    /**
     *  @brief Return the number of tabulated energy release components
     */
    int numberTabulatedComponents() const { return this->NFC(); }

    /**
     *  @brief Return the number of tabulated energy release components
     */
    int NPLY() const { return std::visit( [] ( const auto& v ) -> long
                                             { return v.NPLY(); },
                                          this->data_ ); }

    /**
     *  @brief Return the polynomial expansion order
     */
    int order() const { return this->NPLY(); }

    /**
     *  @brief Return the fission energy release data
     */
    const FissionEnergyReleaseData& energyRelease() const {

      return this->data_;
    }

    /**
     *  @brief Return the number of lines in this MF1/MT458 section
     */
    long NC() const { return 1 + std::visit( [] ( const auto& v ) -> long
                                                { return v.NC(); },
                                             this->data_ ); }

    #include "ENDFtk/section/1/458/src/print.hpp"

    /**
     *  @brief Return the MT number of the section
     */
    static constexpr int sectionNumber(){ return 458; }

    using BaseWithoutMT::MT;
    using BaseWithoutMT::ZA;
    using BaseWithoutMT::targetIdentifier;
    using BaseWithoutMT::AWR;
    using BaseWithoutMT::atomicWeightRatio;
  }